

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_coding.c
# Opt level: O0

void WebRtcIsac_EncodeRc(int16_t *RCQ15,Bitstr *streamdata)

{
  short sVar1;
  uint uVar2;
  bool bVar3;
  uint local_38 [2];
  int index [6];
  int k;
  Bitstr *streamdata_local;
  int16_t *RCQ15_local;
  
  for (index[5] = 0; index[5] < 6; index[5] = index[5] + 1) {
    local_38[index[5]] = (uint)WebRtcIsac_kQArRcInitIndex[index[5]];
    if (WebRtcIsac_kQArBoundaryLevels[(int)local_38[index[5]]] < RCQ15[index[5]]) {
      while( true ) {
        bVar3 = false;
        if ((int)(local_38[index[5]] + 1) < 0xc) {
          bVar3 = WebRtcIsac_kQArBoundaryLevels[(int)(local_38[index[5]] + 1)] < RCQ15[index[5]];
        }
        if (!bVar3) break;
        local_38[index[5]] = local_38[index[5]] + 1;
      }
    }
    else {
      do {
        bVar3 = false;
        if (0 < (int)local_38[index[5]]) {
          sVar1 = RCQ15[index[5]];
          uVar2 = local_38[index[5]];
          local_38[index[5]] = uVar2 - 1;
          bVar3 = sVar1 < WebRtcIsac_kQArBoundaryLevels[(int)(uVar2 - 1)];
        }
      } while (bVar3);
    }
    RCQ15[index[5]] = WebRtcIsac_kQArRcLevelsPtr[index[5]][(int)local_38[index[5]]];
  }
  WebRtcIsac_EncHistMulti(streamdata,(int *)local_38,WebRtcIsac_kQArRcCdfPtr,6);
  return;
}

Assistant:

void WebRtcIsac_EncodeRc(int16_t* RCQ15, Bitstr* streamdata) {
  int k;
  int index[AR_ORDER];

  /* quantize reflection coefficients (add noise feedback?) */
  for (k = 0; k < AR_ORDER; k++) {
    index[k] = WebRtcIsac_kQArRcInitIndex[k];
    // The safe-guards in following while conditions are to suppress gcc 4.8.3
    // warnings, Issue 2888. Otherwise, first and last elements of
    // |WebRtcIsac_kQArBoundaryLevels| are such that the following search
    // *never* cause an out-of-boundary read.
    if (RCQ15[k] > WebRtcIsac_kQArBoundaryLevels[index[k]]) {
      while (index[k] + 1 < NUM_AR_RC_QUANT_BAUNDARY &&
        RCQ15[k] > WebRtcIsac_kQArBoundaryLevels[index[k] + 1]) {
        index[k]++;
      }
    } else {
      while (index[k] > 0 &&
        RCQ15[k] < WebRtcIsac_kQArBoundaryLevels[--index[k]]) ;
    }
    RCQ15[k] = *(WebRtcIsac_kQArRcLevelsPtr[k] + index[k]);
  }

  /* entropy coding of quantization indices */
  WebRtcIsac_EncHistMulti(streamdata, index, WebRtcIsac_kQArRcCdfPtr, AR_ORDER);
}